

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSreadCols<double>
               (MPSInput *mps,LPRowSetBase<double> *rset,NameSet *rnames,LPColSetBase<double> *cset,
               NameSet *cnames,DIdxSet *intvars)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *this;
  undefined8 *puVar4;
  char *__s2;
  NameSet *in_RDX;
  MPSInput *in_RDI;
  long in_R9;
  int ncnames;
  DSVectorBase<double> vec;
  LPColBase<double> col;
  char colname [256];
  int idx;
  double val;
  MPSInput *in_stack_fffffffffffffd88;
  MPSInput *in_stack_fffffffffffffd90;
  NameSet *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  char *in_stack_fffffffffffffda8;
  MPSInput *in_stack_fffffffffffffdb0;
  double local_1e0;
  MPSInput *in_stack_fffffffffffffe28;
  double local_1d0;
  double local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  double local_1b8 [3];
  LPColBase<double> local_180;
  char local_148 [248];
  ulong uStack_50;
  int local_3c;
  double local_38;
  long local_30;
  NameSet *local_18;
  MPSInput *local_8;
  
  local_148[0xf0] = '\0';
  local_148[0xf1] = '\0';
  local_148[0xf2] = '\0';
  local_148[0xf3] = '\0';
  local_148[0xf4] = '\0';
  local_148[0xf5] = '\0';
  local_148[0xf6] = '\0';
  local_148[0xf7] = '\0';
  uStack_50 = 0;
  local_148[0xe0] = '\0';
  local_148[0xe1] = '\0';
  local_148[0xe2] = '\0';
  local_148[0xe3] = '\0';
  local_148[0xe4] = '\0';
  local_148[0xe5] = '\0';
  local_148[0xe6] = '\0';
  local_148[0xe7] = '\0';
  local_148[0xe8] = '\0';
  local_148[0xe9] = '\0';
  local_148[0xea] = '\0';
  local_148[0xeb] = '\0';
  local_148[0xec] = '\0';
  local_148[0xed] = '\0';
  local_148[0xee] = '\0';
  local_148[0xef] = '\0';
  local_148[0xd0] = '\0';
  local_148[0xd1] = '\0';
  local_148[0xd2] = '\0';
  local_148[0xd3] = '\0';
  local_148[0xd4] = '\0';
  local_148[0xd5] = '\0';
  local_148[0xd6] = '\0';
  local_148[0xd7] = '\0';
  local_148[0xd8] = '\0';
  local_148[0xd9] = '\0';
  local_148[0xda] = '\0';
  local_148[0xdb] = '\0';
  local_148[0xdc] = '\0';
  local_148[0xdd] = '\0';
  local_148[0xde] = '\0';
  local_148[0xdf] = '\0';
  local_148[0xc0] = '\0';
  local_148[0xc1] = '\0';
  local_148[0xc2] = '\0';
  local_148[0xc3] = '\0';
  local_148[0xc4] = '\0';
  local_148[0xc5] = '\0';
  local_148[0xc6] = '\0';
  local_148[199] = '\0';
  local_148[200] = '\0';
  local_148[0xc9] = '\0';
  local_148[0xca] = '\0';
  local_148[0xcb] = '\0';
  local_148[0xcc] = '\0';
  local_148[0xcd] = '\0';
  local_148[0xce] = '\0';
  local_148[0xcf] = '\0';
  local_148[0xb0] = '\0';
  local_148[0xb1] = '\0';
  local_148[0xb2] = '\0';
  local_148[0xb3] = '\0';
  local_148[0xb4] = '\0';
  local_148[0xb5] = '\0';
  local_148[0xb6] = '\0';
  local_148[0xb7] = '\0';
  local_148[0xb8] = '\0';
  local_148[0xb9] = '\0';
  local_148[0xba] = '\0';
  local_148[0xbb] = '\0';
  local_148[0xbc] = '\0';
  local_148[0xbd] = '\0';
  local_148[0xbe] = '\0';
  local_148[0xbf] = '\0';
  local_148[0xa0] = '\0';
  local_148[0xa1] = '\0';
  local_148[0xa2] = '\0';
  local_148[0xa3] = '\0';
  local_148[0xa4] = '\0';
  local_148[0xa5] = '\0';
  local_148[0xa6] = '\0';
  local_148[0xa7] = '\0';
  local_148[0xa8] = '\0';
  local_148[0xa9] = '\0';
  local_148[0xaa] = '\0';
  local_148[0xab] = '\0';
  local_148[0xac] = '\0';
  local_148[0xad] = '\0';
  local_148[0xae] = '\0';
  local_148[0xaf] = '\0';
  local_148[0x90] = '\0';
  local_148[0x91] = '\0';
  local_148[0x92] = '\0';
  local_148[0x93] = '\0';
  local_148[0x94] = '\0';
  local_148[0x95] = '\0';
  local_148[0x96] = '\0';
  local_148[0x97] = '\0';
  local_148[0x98] = '\0';
  local_148[0x99] = '\0';
  local_148[0x9a] = '\0';
  local_148[0x9b] = '\0';
  local_148[0x9c] = '\0';
  local_148[0x9d] = '\0';
  local_148[0x9e] = '\0';
  local_148[0x9f] = '\0';
  local_148[0x80] = '\0';
  local_148[0x81] = '\0';
  local_148[0x82] = '\0';
  local_148[0x83] = '\0';
  local_148[0x84] = '\0';
  local_148[0x85] = '\0';
  local_148[0x86] = '\0';
  local_148[0x87] = '\0';
  local_148[0x88] = '\0';
  local_148[0x89] = '\0';
  local_148[0x8a] = '\0';
  local_148[0x8b] = '\0';
  local_148[0x8c] = '\0';
  local_148[0x8d] = '\0';
  local_148[0x8e] = '\0';
  local_148[0x8f] = '\0';
  local_148[0x70] = '\0';
  local_148[0x71] = '\0';
  local_148[0x72] = '\0';
  local_148[0x73] = '\0';
  local_148[0x74] = '\0';
  local_148[0x75] = '\0';
  local_148[0x76] = '\0';
  local_148[0x77] = '\0';
  local_148[0x78] = '\0';
  local_148[0x79] = '\0';
  local_148[0x7a] = '\0';
  local_148[0x7b] = '\0';
  local_148[0x7c] = '\0';
  local_148[0x7d] = '\0';
  local_148[0x7e] = '\0';
  local_148[0x7f] = '\0';
  local_148[0x60] = '\0';
  local_148[0x61] = '\0';
  local_148[0x62] = '\0';
  local_148[99] = '\0';
  local_148[100] = '\0';
  local_148[0x65] = '\0';
  local_148[0x66] = '\0';
  local_148[0x67] = '\0';
  local_148[0x68] = '\0';
  local_148[0x69] = '\0';
  local_148[0x6a] = '\0';
  local_148[0x6b] = '\0';
  local_148[0x6c] = '\0';
  local_148[0x6d] = '\0';
  local_148[0x6e] = '\0';
  local_148[0x6f] = '\0';
  local_148[0x50] = '\0';
  local_148[0x51] = '\0';
  local_148[0x52] = '\0';
  local_148[0x53] = '\0';
  local_148[0x54] = '\0';
  local_148[0x55] = '\0';
  local_148[0x56] = '\0';
  local_148[0x57] = '\0';
  local_148[0x58] = '\0';
  local_148[0x59] = '\0';
  local_148[0x5a] = '\0';
  local_148[0x5b] = '\0';
  local_148[0x5c] = '\0';
  local_148[0x5d] = '\0';
  local_148[0x5e] = '\0';
  local_148[0x5f] = '\0';
  local_148[0x40] = '\0';
  local_148[0x41] = '\0';
  local_148[0x42] = '\0';
  local_148[0x43] = '\0';
  local_148[0x44] = '\0';
  local_148[0x45] = '\0';
  local_148[0x46] = '\0';
  local_148[0x47] = '\0';
  local_148[0x48] = '\0';
  local_148[0x49] = '\0';
  local_148[0x4a] = '\0';
  local_148[0x4b] = '\0';
  local_148[0x4c] = '\0';
  local_148[0x4d] = '\0';
  local_148[0x4e] = '\0';
  local_148[0x4f] = '\0';
  local_148[0x30] = '\0';
  local_148[0x31] = '\0';
  local_148[0x32] = '\0';
  local_148[0x33] = '\0';
  local_148[0x34] = '\0';
  local_148[0x35] = '\0';
  local_148[0x36] = '\0';
  local_148[0x37] = '\0';
  local_148[0x38] = '\0';
  local_148[0x39] = '\0';
  local_148[0x3a] = '\0';
  local_148[0x3b] = '\0';
  local_148[0x3c] = '\0';
  local_148[0x3d] = '\0';
  local_148[0x3e] = '\0';
  local_148[0x3f] = '\0';
  local_148[0x20] = '\0';
  local_148[0x21] = '\0';
  local_148[0x22] = '\0';
  local_148[0x23] = '\0';
  local_148[0x24] = '\0';
  local_148[0x25] = '\0';
  local_148[0x26] = '\0';
  local_148[0x27] = '\0';
  local_148[0x28] = '\0';
  local_148[0x29] = '\0';
  local_148[0x2a] = '\0';
  local_148[0x2b] = '\0';
  local_148[0x2c] = '\0';
  local_148[0x2d] = '\0';
  local_148[0x2e] = '\0';
  local_148[0x2f] = '\0';
  local_148[0x10] = '\0';
  local_148[0x11] = '\0';
  local_148[0x12] = '\0';
  local_148[0x13] = '\0';
  local_148[0x14] = '\0';
  local_148[0x15] = '\0';
  local_148[0x16] = '\0';
  local_148[0x17] = '\0';
  local_148[0x18] = '\0';
  local_148[0x19] = '\0';
  local_148[0x1a] = '\0';
  local_148[0x1b] = '\0';
  local_148[0x1c] = '\0';
  local_148[0x1d] = '\0';
  local_148[0x1e] = '\0';
  local_148[0x1f] = '\0';
  local_148[0] = '\0';
  local_148[1] = '\0';
  local_148[2] = '\0';
  local_148[3] = '\0';
  local_148[4] = '\0';
  local_148[5] = '\0';
  local_148[6] = '\0';
  local_148[7] = '\0';
  local_148[8] = '\0';
  local_148[9] = '\0';
  local_148[10] = '\0';
  local_148[0xb] = '\0';
  local_148[0xc] = '\0';
  local_148[0xd] = '\0';
  local_148[0xe] = '\0';
  local_148[0xf] = '\0';
  local_30 = in_R9;
  local_18 = in_RDX;
  local_8 = in_RDI;
  LPRowSetBase<double>::num((LPRowSetBase<double> *)0x13b96f);
  LPColBase<double>::LPColBase
            ((LPColBase<double> *)in_stack_fffffffffffffd90,
             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  local_1b8[0] = 0.0;
  LPColBase<double>::setObj(&local_180,local_1b8);
  SVectorBase<double>::clear((SVectorBase<double> *)0x13b9c6);
  do {
    bVar1 = MPSInput::readLine(in_stack_fffffffffffffe28);
    if (!bVar1) {
LAB_0013bf85:
      MPSInput::syntaxError(in_stack_fffffffffffffd90);
      local_1bc = 0;
LAB_0013bf9f:
      DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)in_stack_fffffffffffffd90);
      LPColBase<double>::~LPColBase((LPColBase<double> *)0x13bfb9);
      return;
    }
    pcVar3 = MPSInput::field0(local_8);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = MPSInput::field0(local_8);
      iVar2 = strcmp(pcVar3,"RHS");
      if (iVar2 == 0) {
        if (local_148[0] != '\0') {
          LPColBase<double>::setColVector
                    ((LPColBase<double> *)in_stack_fffffffffffffd90,
                     (SVectorBase<double> *)in_stack_fffffffffffffd88);
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (LPColBase<double> *)in_stack_fffffffffffffd98);
        }
        MPSInput::setSection(local_8,RHS);
        local_1bc = 1;
        goto LAB_0013bf9f;
      }
      goto LAB_0013bf85;
    }
    pcVar3 = MPSInput::field1(local_8);
    if (((pcVar3 == (char *)0x0) || (pcVar3 = MPSInput::field2(local_8), pcVar3 == (char *)0x0)) ||
       (pcVar3 = MPSInput::field3(local_8), pcVar3 == (char *)0x0)) goto LAB_0013bf85;
    pcVar3 = MPSInput::field1(local_8);
    iVar2 = strcmp(local_148,pcVar3);
    if (iVar2 != 0) {
      if (local_148[0] != '\0') {
        LPColBase<double>::setColVector
                  ((LPColBase<double> *)in_stack_fffffffffffffd90,
                   (SVectorBase<double> *)in_stack_fffffffffffffd88);
        LPColSetBase<double>::add
                  ((LPColSetBase<double> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (LPColBase<double> *)in_stack_fffffffffffffd98);
      }
      pcVar3 = MPSInput::field1(local_8);
      spxSnprintf(local_148,0xff,"%s",pcVar3);
      uStack_50 = uStack_50 & 0xffffffffffffff;
      local_1c0 = NameSet::size((NameSet *)0x13bbb1);
      NameSet::add((NameSet *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (char *)in_stack_fffffffffffffd98);
      iVar2 = NameSet::size((NameSet *)0x13bbd9);
      if (iVar2 <= local_1c0) {
        this = std::operator<<((ostream *)&std::cerr,
                               "ERROR in COLUMNS: duplicate column name or not column-wise ordering"
                              );
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        goto LAB_0013bf85;
      }
      SVectorBase<double>::clear((SVectorBase<double> *)0x13bc21);
      local_1c8 = 0.0;
      LPColBase<double>::setObj(&local_180,&local_1c8);
      local_1d0 = 0.0;
      LPColBase<double>::setLower(&local_180,&local_1d0);
      puVar4 = (undefined8 *)infinity();
      in_stack_fffffffffffffe28 = (MPSInput *)*puVar4;
      LPColBase<double>::setUpper(&local_180,(double *)&stack0xfffffffffffffe28);
      bVar1 = MPSInput::isInteger(local_8);
      if (bVar1) {
        if (local_30 != 0) {
          NameSet::number(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
          DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffd90,
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        }
        local_1e0 = 1.0;
        LPColBase<double>::setUpper(&local_180,&local_1e0);
      }
    }
    pcVar3 = MPSInput::field3(local_8);
    local_38 = atof(pcVar3);
    pcVar3 = MPSInput::field2(local_8);
    __s2 = MPSInput::objName(local_8);
    iVar2 = strcmp(pcVar3,__s2);
    if (iVar2 == 0) {
      LPColBase<double>::setObj(&local_180,&local_38);
    }
    else {
      MPSInput::field2(local_8);
      local_3c = NameSet::number(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      if (local_3c < 0) {
        in_stack_fffffffffffffdb0 = local_8;
        MPSInput::field1(local_8);
        MPSInput::field2(local_8);
        MPSInput::entryIgnored
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                   (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      }
      else if ((local_38 != 0.0) || (NAN(local_38))) {
        DSVectorBase<double>::add
                  ((DSVectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                   (double *)in_stack_fffffffffffffd90);
      }
    }
    pcVar3 = MPSInput::field5(local_8);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = MPSInput::field5(local_8);
      local_38 = atof(pcVar3);
      in_stack_fffffffffffffda8 = MPSInput::field4(local_8);
      pcVar3 = MPSInput::objName(local_8);
      iVar2 = strcmp(in_stack_fffffffffffffda8,pcVar3);
      if (iVar2 == 0) {
        LPColBase<double>::setObj(&local_180,&local_38);
      }
      else {
        in_stack_fffffffffffffd98 = local_18;
        MPSInput::field4(local_8);
        in_stack_fffffffffffffda4 =
             NameSet::number(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
        local_3c = in_stack_fffffffffffffda4;
        if (in_stack_fffffffffffffda4 < 0) {
          in_stack_fffffffffffffd88 = local_8;
          in_stack_fffffffffffffd90 = (MPSInput *)MPSInput::field1(local_8);
          MPSInput::field4(local_8);
          MPSInput::entryIgnored
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
        }
        else if ((local_38 != 0.0) || (NAN(local_38))) {
          DSVectorBase<double>::add
                    ((DSVectorBase<double> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                     (double *)in_stack_fffffffffffffd90);
        }
      }
    }
  } while( true );
}

Assistant:

static void MPSreadCols(MPSInput& mps, const LPRowSetBase<R>& rset, const NameSet&  rnames,
                        LPColSetBase<R>& cset, NameSet& cnames, DIdxSet* intvars)
{
   R val;
   int idx;
   char colname[MPSInput::MAX_LINE_LEN] = { '\0' };
   LPColBase<R> col(rset.num());
   DSVectorBase<R> vec;

   col.setObj(0.0);
   vec.clear();

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         if(strcmp(mps.field0(), "RHS"))
            break;

         if(colname[0] != '\0')
         {
            col.setColVector(vec);
            cset.add(col);
         }

         mps.setSection(MPSInput::RHS);

         return;
      }

      if((mps.field1() == nullptr) || (mps.field2() == nullptr) || (mps.field3() == nullptr))
         break;

      // new column?
      if(strcmp(colname, mps.field1()))
      {
         // first column?
         if(colname[0] != '\0')
         {
            col.setColVector(vec);
            cset.add(col);
         }

         // save copy of string (make sure string ends with \0)
         spxSnprintf(colname, MPSInput::MAX_LINE_LEN - 1, "%s", mps.field1());
         colname[MPSInput::MAX_LINE_LEN - 1] = '\0';

         int ncnames = cnames.size();
         cnames.add(colname);

         // check whether the new name is unique wrt previous column names
         if(cnames.size() <= ncnames)
         {
            SPX_MSG_ERROR(std::cerr << "ERROR in COLUMNS: duplicate column name or not column-wise ordering" <<
                          std::endl;)
            break;
         }

         vec.clear();
         col.setObj(0.0);
         col.setLower(0.0);
         col.setUpper(R(infinity));

         if(mps.isInteger())
         {
            assert(cnames.number(colname) == cset.num());

            if(intvars != nullptr)
               intvars->addIdx(cnames.number(colname));

            // for Integer variable the default bounds are 0/1
            col.setUpper(1.0);
         }
      }

      val = atof(mps.field3());

      if(!strcmp(mps.field2(), mps.objName()))
         col.setObj(val);
      else
      {
         if((idx = rnames.number(mps.field2())) < 0)
            mps.entryIgnored("Column", mps.field1(), "row", mps.field2());
         else if(val != 0.0)
            vec.add(idx, val);
      }

      if(mps.field5() != nullptr)
      {
         assert(mps.field4() != nullptr);

         val = atof(mps.field5());

         if(!strcmp(mps.field4(), mps.objName()))
            col.setObj(val);
         else
         {
            if((idx = rnames.number(mps.field4())) < 0)
               mps.entryIgnored("Column", mps.field1(), "row", mps.field4());
            else if(val != 0.0)
               vec.add(idx, val);
         }
      }
   }

   mps.syntaxError();
}